

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

void fmt::v11::detail::fwrite_all(void *ptr,size_t count,FILE *stream)

{
  uint uVar1;
  size_t sVar2;
  undefined8 uVar3;
  uint *puVar4;
  basic_string_view<char> fmt;
  string_view fmt_00;
  undefined4 local_58 [2];
  undefined8 local_50;
  undefined4 local_48;
  char *local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined1 *local_28;
  undefined8 local_20;
  
  sVar2 = fwrite(ptr,1,count,(FILE *)stream);
  if (count <= sVar2) {
    return;
  }
  uVar3 = __cxa_allocate_exception(0x20);
  puVar4 = (uint *)__errno_location();
  uVar1 = *puVar4;
  local_58[0] = 0;
  local_50 = 0;
  local_48 = 0;
  local_40 = "cannot write to file";
  local_38 = 0x14;
  local_30 = 0;
  local_20 = 0;
  fmt.size_ = (size_t)local_58;
  fmt.data_ = (char *)0x14;
  local_28 = (undefined1 *)local_58;
  parse_format_string<char,fmt::v11::detail::format_string_checker<char,0,0,false>>
            ((detail *)"cannot write to file",fmt,(format_string_checker<char,_0,_0,_false> *)stream
            );
  fmt_00.data_ = (char *)(ulong)uVar1;
  fmt_00.size_ = (size_t)"cannot write to file";
  vsystem_error((int)uVar3,fmt_00,(format_args)ZEXT816(0x14));
  __cxa_throw(uVar3,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

inline void fwrite_all(const void* ptr, size_t count, FILE* stream) {
  size_t written = std::fwrite(ptr, 1, count, stream);
  if (written < count)
    FMT_THROW(system_error(errno, FMT_STRING("cannot write to file")));
}